

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_definitions.c
# Opt level: O3

int sasl_outcome_set_code(SASL_OUTCOME_HANDLE sasl_outcome,sasl_code code_value)

{
  int iVar1;
  AMQP_VALUE item_value;
  int iVar2;
  SASL_OUTCOME_INSTANCE *sasl_outcome_instance;
  
  if (sasl_outcome == (SASL_OUTCOME_HANDLE)0x0) {
    iVar2 = 0x2e1c;
  }
  else {
    item_value = amqpvalue_create_ubyte(code_value);
    if (item_value == (AMQP_VALUE)0x0) {
      iVar2 = 0x2e24;
    }
    else {
      iVar1 = amqpvalue_set_composite_item(sasl_outcome->composite_value,0,item_value);
      iVar2 = 0x2e2a;
      if (iVar1 == 0) {
        iVar2 = 0;
      }
      amqpvalue_destroy(item_value);
    }
  }
  return iVar2;
}

Assistant:

int sasl_outcome_set_code(SASL_OUTCOME_HANDLE sasl_outcome, sasl_code code_value)
{
    int result;

    if (sasl_outcome == NULL)
    {
        result = MU_FAILURE;
    }
    else
    {
        SASL_OUTCOME_INSTANCE* sasl_outcome_instance = (SASL_OUTCOME_INSTANCE*)sasl_outcome;
        AMQP_VALUE code_amqp_value = amqpvalue_create_sasl_code(code_value);
        if (code_amqp_value == NULL)
        {
            result = MU_FAILURE;
        }
        else
        {
            if (amqpvalue_set_composite_item(sasl_outcome_instance->composite_value, 0, code_amqp_value) != 0)
            {
                result = MU_FAILURE;
            }
            else
            {
                result = 0;
            }

            amqpvalue_destroy(code_amqp_value);
        }
    }

    return result;
}